

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_UInt32 UA_NodeId_hash(UA_NodeId *n)

{
  UA_NodeId *n_local;
  
  switch(n->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
  default:
    n_local._4_4_ = (uint)n->namespaceIndex + (n->identifier).numeric * -0x61c8864f;
    break;
  case UA_NODEIDTYPE_STRING:
  case UA_NODEIDTYPE_BYTESTRING:
    n_local._4_4_ =
         fnv32((uint)n->namespaceIndex,(n->identifier).string.data,(n->identifier).string.length);
    break;
  case UA_NODEIDTYPE_GUID:
    n_local._4_4_ = fnv32((uint)n->namespaceIndex,(UA_Byte *)&(n->identifier).numeric,0x10);
  }
  return n_local._4_4_;
}

Assistant:

UA_UInt32
UA_NodeId_hash(const UA_NodeId *n) {
    switch(n->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
    default:
        return (UA_UInt32)(n->namespaceIndex + (n->identifier.numeric * 2654435761)); /*  Knuth's multiplicative hashing */
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
        return fnv32(n->namespaceIndex, n->identifier.string.data, n->identifier.string.length);
    case UA_NODEIDTYPE_GUID:
        return fnv32(n->namespaceIndex, (const UA_Byte*)&n->identifier.guid, sizeof(UA_Guid));
    }
}